

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder_exception.hpp
# Opt level: O2

void __thiscall
duckdb::BinderException::BinderException<std::__cxx11::string>
          (BinderException *this,string *msg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  string sStack_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,(string *)params);
  Exception::ConstructMessage<std::__cxx11::string>(&sStack_58,(Exception *)msg,&local_38,in_RCX);
  duckdb::BinderException::BinderException(this,(string *)&sStack_58);
  std::__cxx11::string::~string((string *)&sStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

explicit BinderException(const string &msg, ARGS... params) : BinderException(ConstructMessage(msg, params...)) {
	}